

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

bool __thiscall kj::_::XThreadFulfiller<int>::isWaiting(XThreadFulfiller<int> *this)

{
  XThreadPaf *pXVar1;
  XThreadPaf *t;
  XThreadPaf *_t2142;
  XThreadFulfiller<int> *this_local;
  
  pXVar1 = readMaybe<kj::_::XThreadPaf>(this->target);
  if (pXVar1 == (XThreadPaf *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = pXVar1->state == WAITING;
  }
  return this_local._7_1_;
}

Assistant:

bool isWaiting() const override {
    KJ_IF_SOME(t, target) {
#if _MSC_VER && !__clang__
      // Just assume 1-byte loads are atomic... on what kind of absurd platform would they not be?
      return t.state == XThreadPaf::WAITING;
#else
      return __atomic_load_n(&t.state, __ATOMIC_RELAXED) == XThreadPaf::WAITING;
#endif
    } else {
      return false;
    }
  }